

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char * find_module_env_file(char *apprun_path)

{
  int iVar1;
  size_t sVar2;
  char *possible_path;
  unsigned_long possible_path_len;
  unsigned_long apprun_env_extension_len;
  char *pcStack_18;
  char apprun_env_extension [5];
  char *apprun_path_local;
  
  apprun_env_extension_len._3_4_ = 0x766e652e;
  apprun_env_extension_len._7_1_ = 0;
  pcStack_18 = apprun_path;
  sVar2 = strlen(apprun_path);
  apprun_path_local = (char *)malloc(sVar2 + 5);
  memset(apprun_path_local,0,sVar2 + 5);
  apprun_concat_path(apprun_path_local,pcStack_18);
  strncat(apprun_path_local,(char *)((long)&apprun_env_extension_len + 3),4);
  iVar1 = access(apprun_path_local,0);
  if (iVar1 != 0) {
    free(apprun_path_local);
    apprun_path_local = (char *)0x0;
  }
  return apprun_path_local;
}

Assistant:

char *find_module_env_file(char *apprun_path) {
    const char apprun_env_extension[] = ".env";
    const unsigned long apprun_env_extension_len = strlen(apprun_env_extension);

    const unsigned long possible_path_len = strlen(apprun_path) + apprun_env_extension_len + 1;
    char *possible_path = malloc(possible_path_len);
    memset(possible_path, 0, possible_path_len);

    apprun_concat_path(possible_path, apprun_path);
    strncat(possible_path, apprun_env_extension, apprun_env_extension_len);

#ifdef DEBUG
    fprintf(stderr, "APPRUN_DEBUG: Looking for %s file at: %s\n", apprun_env_extension, possible_path);
#endif
    if (access(possible_path, F_OK) == 0)
        return possible_path;
    else
        free(possible_path);


    return NULL;
}